

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

SC_Cell * Abc_SclFindInvertor(SC_Lib *p,int fFindBuff)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  SC_Cell *pSVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = -0x5555555555555556;
  if (fFindBuff == 0) {
    lVar3 = 0x5555555555555555;
  }
  lVar5 = (long)(p->vCellClasses).nSize;
  if (lVar5 < 1) {
    pSVar4 = (SC_Cell *)0x0;
  }
  else {
    lVar6 = 0;
    do {
      pvVar1 = (p->vCellClasses).pArray[lVar6];
      if (*(int *)((long)pvVar1 + 0x40) == 1) {
        if (*(int *)((long)pvVar1 + 0x34) < 2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x38) + 8);
        if (*(int *)(lVar2 + 0x34) < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        if (**(long **)(lVar2 + 0x38) == lVar3) break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
    pSVar4 = *(SC_Cell **)((long)pvVar1 + 0x58);
  }
  return pSVar4;
}

Assistant:

SC_Cell * Abc_SclFindInvertor( SC_Lib * p, int fFindBuff )
{
    SC_Cell * pCell = NULL;
    word Truth = fFindBuff ? ABC_CONST(0xAAAAAAAAAAAAAAAA) : ABC_CONST(0x5555555555555555);
    int k;
    SC_LibForEachCellClass( p, pCell, k )
        if ( pCell->n_inputs == 1 && Vec_WrdEntry(&SC_CellPin(pCell, 1)->vFunc, 0) == Truth )
            break;
    // take representative
    return pCell ? pCell->pRepr : NULL;
}